

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O3

Test * anon_unknown.dwarf_e210f::StatTestSimple::Create(void)

{
  StateTestWithBuiltinRules *pSVar1;
  StateTestWithBuiltinRules *this;
  _Rb_tree_header *p_Var2;
  
  this = (StateTestWithBuiltinRules *)operator_new(0x1a8);
  StateTestWithBuiltinRules::StateTestWithBuiltinRules(this);
  pSVar1 = this + 1;
  this[1].super_Test.failed_ = false;
  *(undefined3 *)&this[1].super_Test.field_0x9 = 0;
  this[1].super_Test.assertion_failures_ = 0;
  this[1].state_.paths_._M_h._M_buckets = (__buckets_ptr)pSVar1;
  this[1].state_.paths_._M_h._M_bucket_count = (size_type)&this->state_;
  this[1].state_.paths_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)pSVar1;
  this[1].state_.paths_._M_h._M_element_count = 0;
  *(undefined8 *)&this[1].state_.paths_._M_h._M_rehash_policy = 0;
  this[1].state_.paths_._M_h._M_rehash_policy._M_next_resize = (size_t)&this->state_;
  this[1].state_.paths_._M_h._M_single_bucket = (__node_base_ptr)pSVar1;
  p_Var2 = &this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header;
  this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this[1].state_.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this[1].state_.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this[1].state_.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__StatTest_001d2eb8;
  this[1].super_Test._vptr_Test = (_func_int **)&PTR__StatTestSimple_001d2f18;
  g_current_test = (Test *)this;
  return &this->super_Test;
}

Assistant:

TEST_F(StatTest, Simple) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat in\n"));

  Node* out = GetNode("out");
  string err;
  EXPECT_TRUE(out->Stat(this, &err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, stats_.size());
  scan_.RecomputeDirty(out, NULL);
  ASSERT_EQ(2u, stats_.size());
  ASSERT_EQ("out", stats_[0]);
  ASSERT_EQ("in",  stats_[1]);
}